

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

void cht_Give(player_t *player,char *name,int amount)

{
  uint uVar1;
  APlayerPawn *this;
  _func_int *UNRECOVERED_JUMPTABLE;
  PClassWeapon *type;
  BYTE *pBVar2;
  bool bVar3;
  undefined8 *puVar4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  AInventory *pAVar10;
  PClassWeapon *pPVar11;
  PClassActor *pPVar12;
  ulong uVar13;
  bool bVar14;
  DVector3 local_58;
  AWeapon *local_40;
  FWeaponSlots *local_38;
  
  if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
    puVar4 = (undefined8 *)
             ((long)&((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1cf) * 0x18));
    do {
      puVar7 = puVar4;
      puVar4 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x1cf);
    Printf("%s is a cheater: give %s\n",*(undefined8 *)(puVar7[2] + 0x28),name);
  }
  this = player->mo;
  if (this == (APlayerPawn *)0x0) {
    return;
  }
  if (player->health < 1) {
    return;
  }
  iVar6 = strcasecmp(name,"all");
  if (iVar6 == 0) {
    bVar3 = false;
    bVar14 = false;
  }
  else {
    iVar6 = strcasecmp(name,"everything");
    bVar14 = iVar6 == 0;
    bVar3 = !bVar14;
  }
  iVar6 = strcasecmp(name,"health");
  if (iVar6 == 0) {
    if (amount < 1) {
      iVar6 = APlayerPawn::GetMaxHealth(this);
      (player->mo->super_AActor).health = iVar6;
    }
    else {
      iVar6 = (this->super_AActor).health + amount;
      (this->super_AActor).health = iVar6;
    }
    player->health = iVar6;
  }
  if ((bVar3) && (iVar6 = strcasecmp(name,"backpack"), iVar6 != 0)) {
    if ((!bVar3) || (iVar6 = strcasecmp(name,"ammo"), iVar6 == 0)) goto LAB_004c39d9;
    if ((!bVar3) || (iVar6 = strcasecmp(name,"armor"), iVar6 == 0)) goto LAB_004c3a95;
    if ((!bVar3) || (iVar6 = strcasecmp(name,"keys"), iVar6 == 0)) goto LAB_004c3ba1;
    if ((!bVar3) || (iVar6 = strcasecmp(name,"weapons"), iVar6 == 0)) goto LAB_004c3c58;
    if ((bVar3) && (iVar6 = strcasecmp(name,"artifacts"), iVar6 != 0)) {
      if ((bVar3) && (iVar6 = strcasecmp(name,"puzzlepieces"), iVar6 != 0)) {
        if (!bVar3) {
          return;
        }
        pPVar8 = PClass::FindActor(name);
        if (pPVar8 == (PClassActor *)0x0) {
LAB_004c3fa3:
          if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
            return;
          }
          Printf("Unknown item \"%s\"\n",name);
          return;
        }
        pPVar12 = pPVar8;
        if (pPVar8 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
            if (pPVar12 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar12 != (PClassActor *)0x0);
          if (pPVar12 == (PClassActor *)0x0) goto LAB_004c3fa3;
        }
        UNRECOVERED_JUMPTABLE =
             (player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a];
        (*UNRECOVERED_JUMPTABLE)(player->mo,pPVar8,(ulong)(uint)amount,1,UNRECOVERED_JUMPTABLE);
        return;
      }
      if (PClassActor::AllActorClasses.Count == 0) {
        return;
      }
      goto LAB_004c3ee9;
    }
  }
  else {
    pPVar8 = PClass::FindActor(&gameinfo.backpacktype);
    if (pPVar8 != (PClassActor *)0x0) {
      (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                (player->mo,pPVar8,1);
    }
    if (bVar3) {
      return;
    }
LAB_004c39d9:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar13 = 0;
      do {
        pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
        if ((pPVar8->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) {
          pAVar10 = AActor::FindInventory(&player->mo->super_AActor,pPVar8,false);
          if (pAVar10 == (AInventory *)0x0) {
            local_58.X = 0.0;
            local_58.Y = 0.0;
            local_58.Z = 0.0;
            pAVar9 = AActor::StaticSpawn(pPVar8,&local_58,NO_REPLACE,false);
            (*(pAVar9->super_DThinker).super_DObject._vptr_DObject[0x31])(pAVar9,player->mo);
            *(undefined4 *)&pAVar9[1].super_DThinker.super_DObject.Class =
                 *(undefined4 *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4);
          }
          else if (pAVar10->Amount < pAVar10->MaxAmount) {
            pAVar10->Amount = pAVar10->MaxAmount;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < PClassActor::AllActorClasses.Count);
    }
    if (bVar3) {
      return;
    }
LAB_004c3a95:
    if (gameinfo.gametype == GAME_Hexen) {
      iVar6 = 0;
      do {
        local_58.X = 0.0;
        local_58.Y = 0.0;
        local_58.Z = 0.0;
        pAVar10 = (AInventory *)
                  AActor::StaticSpawn((PClassActor *)AHexenArmor::RegistrationInfo.MyClass,&local_58
                                      ,NO_REPLACE,false);
        (pAVar10->super_AActor).health = iVar6;
        pAVar10->Amount = 0;
        bVar5 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar5) {
          (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != 4);
    }
    else {
      local_58.X = 0.0;
      local_58.Y = 0.0;
      local_58.Z = 0.0;
      pAVar10 = (AInventory *)
                AActor::StaticSpawn((PClassActor *)ABasicArmorPickup::RegistrationInfo.MyClass,
                                    &local_58,NO_REPLACE,false);
      *(int *)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext = deh.BlueAC * 100;
      pAVar10[1].super_AActor.super_DThinker.super_DObject._vptr_DObject =
           (_func_int **)
           (~-(ulong)(0.0 < gameinfo.Armor2Percent) & 0x3fe0000000000000 |
           (ulong)gameinfo.Armor2Percent & -(ulong)(0.0 < gameinfo.Armor2Percent));
      bVar5 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
      if (!bVar5) {
        (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
      }
    }
    if (bVar3) {
      return;
    }
LAB_004c3ba1:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar13 = 0;
      do {
        pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
        pPVar12 = pPVar8;
        if (pPVar8 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_004c3bee:
          if ((pPVar8->super_PClass).Defaults[0x4dc] != '\0') {
            local_58.X = 0.0;
            local_58.Y = 0.0;
            local_58.Z = 0.0;
            pAVar10 = (AInventory *)AActor::StaticSpawn(pPVar8,&local_58,NO_REPLACE,false);
            bVar5 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
            if (!bVar5) {
              (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
            }
          }
        }
        else {
          do {
            pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
            if (pPVar12 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
          } while (pPVar12 != (PClassActor *)0x0);
          if (pPVar12 != (PClassActor *)0x0) goto LAB_004c3bee;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < PClassActor::AllActorClasses.Count);
    }
    if (bVar3) {
      return;
    }
LAB_004c3c58:
    local_40 = player->PendingWeapon;
    if (PClassActor::AllActorClasses.Count != 0) {
      local_38 = &player->weapons;
      uVar13 = 0;
      do {
        type = (PClassWeapon *)PClassActor::AllActorClasses.Array[uVar13];
        pPVar11 = type;
        if (type != (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) {
          do {
            pPVar11 = (PClassWeapon *)
                      (pPVar11->super_PClassInventory).super_PClassActor.super_PClass.ParentClass;
            if (pPVar11 == (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) break;
          } while (pPVar11 != (PClassWeapon *)0x0);
          if (pPVar11 != (PClassWeapon *)0x0) {
            pPVar11 = (PClassWeapon *)PClassActor::GetReplacement((PClassActor *)type,true);
            if ((pPVar11 != type) &&
               (pPVar8 = PClassActor::GetReplacement((PClassActor *)type,true),
               pPVar8 != (PClassActor *)ADehackedPickup::RegistrationInfo.MyClass)) {
              do {
                pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
                if (pPVar8 == (PClassActor *)ADehackedPickup::RegistrationInfo.MyClass) break;
              } while (pPVar8 != (PClassActor *)0x0);
              if (pPVar8 == (PClassActor *)0x0) goto LAB_004c3d45;
            }
            bVar5 = FWeaponSlots::LocateWeapon(local_38,type,(int *)0x0,(int *)0x0);
            if ((bVar5) &&
               ((bVar14 ||
                (((type->super_PClassInventory).super_PClassActor.super_PClass.Defaults[0x4df] & 8)
                 == 0)))) {
              (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                        (player->mo,type,1,1);
            }
          }
        }
LAB_004c3d45:
        uVar13 = uVar13 + 1;
      } while (uVar13 < PClassActor::AllActorClasses.Count);
    }
    player->PendingWeapon = local_40;
    if (bVar3) {
      return;
    }
  }
  if (PClassActor::AllActorClasses.Count != 0) {
    uVar13 = 0;
    do {
      pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
      pPVar12 = pPVar8;
      if (pPVar8 == (PClassActor *)AInventory::RegistrationInfo.MyClass) {
LAB_004c3dc7:
        pBVar2 = (pPVar8->super_PClass).Defaults;
        if (((0 < *(int *)(pBVar2 + 0x4b8)) && (1 < *(int *)(pBVar2 + 0x4ac))) &&
           (pPVar12 = pPVar8, pPVar8 != (PClassActor *)APuzzleItem::RegistrationInfo.MyClass)) {
          do {
            pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
            if (pPVar12 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) break;
          } while (pPVar12 != (PClassActor *)0x0);
          if ((pPVar12 == (PClassActor *)0x0) &&
             (pPVar12 = pPVar8, pPVar8 != (PClassActor *)APowerup::RegistrationInfo.MyClass)) {
            do {
              pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
              if (pPVar12 == (PClassActor *)APowerup::RegistrationInfo.MyClass) break;
            } while (pPVar12 != (PClassActor *)0x0);
            if ((pPVar12 == (PClassActor *)0x0) &&
               (pPVar12 = pPVar8, pPVar8 != (PClassActor *)AArmor::RegistrationInfo.MyClass)) {
              do {
                pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
                if (pPVar12 == (PClassActor *)AArmor::RegistrationInfo.MyClass) break;
              } while (pPVar12 != (PClassActor *)0x0);
              if ((pPVar12 == (PClassActor *)0x0) &&
                 ((bVar14 || (pPVar12 = PClassActor::GetReplacement(pPVar8,true), pPVar12 == pPVar8)
                  ))) {
                uVar1 = amount;
                if (amount < 1) {
                  uVar1 = *(uint *)(pBVar2 + 0x4ac);
                }
                (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                          (player->mo,pPVar8,(ulong)uVar1,1);
              }
            }
          }
        }
      }
      else {
        do {
          pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
          if (pPVar12 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar12 != (PClassActor *)0x0);
        if (pPVar12 != (PClassActor *)0x0) goto LAB_004c3dc7;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < PClassActor::AllActorClasses.Count);
  }
  if (bVar3 || PClassActor::AllActorClasses.Count == 0) {
    return;
  }
LAB_004c3ee9:
  uVar13 = 0;
  do {
    pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
    pPVar12 = pPVar8;
    if (pPVar8 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) {
LAB_004c3f23:
      pBVar2 = (pPVar8->super_PClass).Defaults;
      if ((0 < *(int *)(pBVar2 + 0x4b8)) &&
         ((bVar14 || (pPVar12 = PClassActor::GetReplacement(pPVar8,true), pPVar12 == pPVar8)))) {
        uVar1 = amount;
        if (amount < 1) {
          uVar1 = *(uint *)(pBVar2 + 0x4ac);
        }
        (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                  (player->mo,pPVar8,(ulong)uVar1,1);
      }
    }
    else {
      do {
        pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
        if (pPVar12 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) break;
      } while (pPVar12 != (PClassActor *)0x0);
      if (pPVar12 != (PClassActor *)0x0) goto LAB_004c3f23;
    }
    uVar13 = uVar13 + 1;
    if (PClassActor::AllActorClasses.Count <= uVar13) {
      return;
    }
  } while( true );
}

Assistant:

void cht_Give (player_t *player, const char *name, int amount)
{
	enum { ALL_NO, ALL_YES, ALL_YESYES } giveall;
	int i;
	PClassActor *type;

	if (player != &players[consoleplayer])
		Printf ("%s is a cheater: give %s\n", player->userinfo.GetName(), name);

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	giveall = ALL_NO;
	if (stricmp (name, "all") == 0)
	{
		giveall = ALL_YES;
	}
	else if (stricmp (name, "everything") == 0)
	{
		giveall = ALL_YESYES;
	}

	if (stricmp (name, "health") == 0)
	{
		if (amount > 0)
		{
			player->mo->health += amount;
			player->health = player->mo->health;
		}
		else
		{
			player->health = player->mo->health = player->mo->GetMaxHealth();
		}
	}

	if (giveall || stricmp (name, "backpack") == 0)
	{
		// Select the correct type of backpack based on the game
		type = PClass::FindActor(gameinfo.backpacktype);
		if (type != NULL)
		{
			player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "ammo") == 0)
	{
		// Find every unique type of ammo. Give it to the player if
		// he doesn't have it already, and set each to its maximum.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClassActor *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS(AAmmo))
			{
				PClassAmmo *atype = static_cast<PClassAmmo *>(type);
				AInventory *ammo = player->mo->FindInventory(atype);
				if (ammo == NULL)
				{
					ammo = static_cast<AInventory *>(Spawn (atype));
					ammo->AttachToOwner (player->mo);
					ammo->Amount = ammo->MaxAmount;
				}
				else if (ammo->Amount < ammo->MaxAmount)
				{
					ammo->Amount = ammo->MaxAmount;
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "armor") == 0)
	{
		if (gameinfo.gametype != GAME_Hexen)
		{
			ABasicArmorPickup *armor = Spawn<ABasicArmorPickup> ();
			armor->SaveAmount = 100*deh.BlueAC;
			armor->SavePercent = gameinfo.Armor2Percent > 0? gameinfo.Armor2Percent : 0.5;
			if (!armor->CallTryPickup (player->mo))
			{
				armor->Destroy ();
			}
		}
		else
		{
			for (i = 0; i < 4; ++i)
			{
				AHexenArmor *armor = Spawn<AHexenArmor> ();
				armor->health = i;
				armor->Amount = 0;
				if (!armor->CallTryPickup (player->mo))
				{
					armor->Destroy ();
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
			{
				AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
				if (key->KeyNumber != 0)
				{
					key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
					if (!key->CallTryPickup (player->mo))
					{
						key->Destroy ();
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "weapons") == 0)
	{
		AWeapon *savedpending = player->PendingWeapon;
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			// Don't give replaced weapons unless the replacement was done by Dehacked.
			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS(AWeapon)) &&
				(static_cast<PClassActor *>(type)->GetReplacement() == type ||
				 static_cast<PClassActor *>(type)->GetReplacement()->IsDescendantOf(RUNTIME_CLASS(ADehackedPickup))))
			{
				// Give the weapon only if it belongs to the current game or
				if (player->weapons.LocateWeapon(static_cast<PClassWeapon*>(type), NULL, NULL))
				{
					AWeapon *def = (AWeapon*)GetDefaultByType (type);
					if (giveall == ALL_YESYES || !(def->WeaponFlags & WIF_CHEATNOTWEAPON))
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
					}
				}
			}
		}
		player->PendingWeapon = savedpending;

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid() && def->MaxAmount > 1 &&
					!type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid())
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall)
		return;

	type = PClass::FindActor(name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount, true);
	}
	return;
}